

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O2

Pipeline * __thiscall
n_e_s::core::Mos6502::create_addressing_steps
          (Pipeline *__return_storage_ptr__,Mos6502 *this,AddressMode address_mode,
          MemoryAccess access)

{
  Pipeline PStack_78;
  
  Pipeline::Pipeline(__return_storage_ptr__);
  switch(address_mode) {
  case Zeropage:
    create_zeropage_addressing_steps(&PStack_78,this,access);
    Pipeline::append(__return_storage_ptr__,&PStack_78);
    break;
  case ZeropageX:
    create_zeropage_indexed_addressing_steps(&PStack_78,this,&this->registers_->x,access);
    Pipeline::append(__return_storage_ptr__,&PStack_78);
    break;
  case ZeropageY:
    create_zeropage_indexed_addressing_steps(&PStack_78,this,&this->registers_->y,access);
    Pipeline::append(__return_storage_ptr__,&PStack_78);
    break;
  default:
    goto switchD_001adce6_caseD_5;
  case Absolute:
    create_absolute_addressing_steps(&PStack_78,this,access);
    Pipeline::append(__return_storage_ptr__,&PStack_78);
    break;
  case AbsoluteX:
    create_absolute_indexed_addressing_steps(&PStack_78,this,&this->registers_->x,access);
    Pipeline::append(__return_storage_ptr__,&PStack_78);
    break;
  case AbsoluteY:
    create_absolute_indexed_addressing_steps(&PStack_78,this,&this->registers_->y,access);
    Pipeline::append(__return_storage_ptr__,&PStack_78);
    break;
  case IndexedIndirect:
    create_indexed_indirect_addressing_steps(&PStack_78,this,access);
    Pipeline::append(__return_storage_ptr__,&PStack_78);
    break;
  case IndirectIndexed:
    create_indirect_indexed_addressing_steps(&PStack_78,this,access);
    Pipeline::append(__return_storage_ptr__,&PStack_78);
  }
  std::
  deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ::~deque(&PStack_78.steps_);
switchD_001adce6_caseD_5:
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_addressing_steps(AddressMode address_mode,
        const MemoryAccess access) {
    Pipeline result;

    switch (address_mode) {
    case AddressMode::Zeropage:
        result.append(create_zeropage_addressing_steps(access));
        break;
    case AddressMode::ZeropageX:
        result.append(create_zeropage_indexed_addressing_steps(
                &registers_->x, access));
        break;
    case AddressMode::ZeropageY:
        result.append(create_zeropage_indexed_addressing_steps(
                &registers_->y, access));
        break;
    case AddressMode::Absolute:
        result.append(create_absolute_addressing_steps(access));
        break;
    case AddressMode::AbsoluteX:
        result.append(create_absolute_indexed_addressing_steps(
                &registers_->x, access));
        break;
    case AddressMode::AbsoluteY:
        result.append(create_absolute_indexed_addressing_steps(
                &registers_->y, access));
        break;
    case AddressMode::IndexedIndirect:
        result.append(create_indexed_indirect_addressing_steps(access));
        break;
    case AddressMode::IndirectIndexed:
        result.append(create_indirect_indexed_addressing_steps(access));
        break;
    default:
        break;
    }

    return result;
}